

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkTraverseSupers(Abc_ShaMan_t *p,int fAnd)

{
  int iVar1;
  Vec_Ptr_t *vInputs_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *Entry;
  int local_38;
  int local_34;
  int nOnesMax;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vInput;
  Vec_Ptr_t *vInputs;
  int fAnd_local;
  Abc_ShaMan_t *p_local;
  
  iVar1 = Abc_NtkObjNumMax(p->pNtk);
  vInputs_00 = Vec_PtrStart(iVar1 * (fAnd + 1));
  Abc_NtkIncrementTravId(p->pNtk);
  if (fAnd == 0) {
    for (local_34 = 0; iVar1 = Abc_NtkCoNum(p->pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCo(p->pNtk,local_34);
      pAVar3 = Abc_ObjFanin0(pAVar2);
      iVar1 = Abc_ObjIsNode(pAVar3);
      if (iVar1 != 0) {
        pAVar2 = Abc_ObjFanin0(pAVar2);
        Abc_NtkTraverseSupersXor_rec(p,pAVar2,vInputs_00);
      }
    }
  }
  else {
    for (local_34 = 0; iVar1 = Abc_NtkCoNum(p->pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCo(p->pNtk,local_34);
      pAVar3 = Abc_ObjFanin0(pAVar2);
      iVar1 = Abc_ObjIsNode(pAVar3);
      if (iVar1 != 0) {
        pAVar2 = Abc_ObjFanin0(pAVar2);
        Abc_NtkTraverseSupersAnd_rec(p,pAVar2,vInputs_00);
      }
    }
  }
  iVar1 = Vec_IntSize(p->vObj2Lit);
  p->nStartCols = iVar1;
  local_38 = 0;
  for (local_34 = 0; iVar1 = Vec_PtrSize(vInputs_00), local_34 < iVar1; local_34 = local_34 + 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vInputs_00,local_34);
    if (pVVar4 != (Vec_Int_t *)0x0) {
      iVar1 = Vec_IntSize(pVVar4);
      local_38 = Abc_MaxInt(local_38,iVar1 + -2);
    }
  }
  if (p->vBuckets == (Vec_Ptr_t *)0x0) {
    pVVar5 = Vec_PtrAlloc(local_38 + 1);
    p->vBuckets = pVVar5;
    for (local_34 = 0; local_34 <= local_38; local_34 = local_34 + 1) {
      pVVar5 = p->vBuckets;
      Entry = Vec_PtrAlloc(10);
      Vec_PtrPush(pVVar5,Entry);
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(vInputs_00), local_34 < iVar1; local_34 = local_34 + 1) {
      pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vInputs_00,local_34);
      if (pVVar4 != (Vec_Int_t *)0x0) {
        pVVar5 = p->vBuckets;
        iVar1 = Vec_IntSize(pVVar4);
        pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar5,iVar1 + -2);
        Vec_PtrPush(pVVar5,pVVar4);
      }
    }
    Vec_PtrFree(vInputs_00);
    return;
  }
  __assert_fail("p->vBuckets == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExtract.c"
                ,0x158,"void Abc_NtkTraverseSupers(Abc_ShaMan_t *, int)");
}

Assistant:

void Abc_NtkTraverseSupers( Abc_ShaMan_t * p, int fAnd )
{
    Vec_Ptr_t * vInputs;
    Vec_Int_t * vInput;
    Abc_Obj_t * pObj;
    int i, nOnesMax;

    // create mapping of nodes into their column vectors
    vInputs = Vec_PtrStart( Abc_NtkObjNumMax(p->pNtk) * (1 + fAnd) );
    Abc_NtkIncrementTravId( p->pNtk );
    if ( fAnd )
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersAnd_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
                Abc_NtkTraverseSupersXor_rec( p, Abc_ObjFanin0(pObj), vInputs );
    }
    p->nStartCols = Vec_IntSize(p->vObj2Lit);

    // find the largest number of 1s
    nOnesMax = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            nOnesMax = Abc_MaxInt( nOnesMax, Vec_IntSize(vInput)-SHARE_NUM );

    // create buckets
    assert( p->vBuckets == NULL );
    p->vBuckets = Vec_PtrAlloc( nOnesMax + 1 );
    for ( i = 0; i <= nOnesMax; i++ )
        Vec_PtrPush( p->vBuckets, Vec_PtrAlloc(10) );

    // load vectors into buckets
    Vec_PtrForEachEntry( Vec_Int_t *, vInputs, vInput, i )
        if ( vInput )
            Vec_PtrPush( (Vec_Ptr_t *)Vec_PtrEntry(p->vBuckets, Vec_IntSize(vInput)-SHARE_NUM), vInput );
    Vec_PtrFree( vInputs );
}